

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screening_interface.hpp
# Opt level: O0

void ExchCXX::mgga_screening_interface<ExchCXX::BuiltinPKZB_X>::eval_exc_unpolar
               (double rho,double sigma,double lapl,double tau,double *eps)

{
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  double sigma_tol_sq;
  double *in_stack_00000120;
  double in_stack_00000128;
  double in_stack_00000130;
  double in_stack_00000138;
  double in_stack_00000140;
  double in_stack_ffffffffffffffc8;
  double x;
  
  if (1e-15 < in_XMM0_Qa) {
    x = 1.0000000000000052e-40;
    safe_max<double>(1.0000000000000052e-40,in_stack_ffffffffffffffc8);
    safe_max<double>(x,in_stack_ffffffffffffffc8);
    enforce_fermi_hole_curvature<double>(x,in_stack_ffffffffffffffc8,8.94301308618199e-318);
    kernel_traits<ExchCXX::BuiltinPKZB_X>::eval_exc_unpolar_impl
              (in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128,
               in_stack_00000120);
  }
  else {
    *in_RDI = 0;
  }
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar( double rho, double sigma, double lapl, double tau, double& eps ) {

    
    if( rho <= traits::dens_tol ) {
      eps = 0.;
    } else {
      constexpr auto sigma_tol_sq = traits::sigma_tol * traits::sigma_tol;
      sigma = safe_max(sigma, sigma_tol_sq); 
      tau   = safe_max(tau, traits::tau_tol);
      if constexpr (not traits::is_kedf) {
        sigma = enforce_fermi_hole_curvature(sigma, rho, tau);
      }

      traits::eval_exc_unpolar_impl(rho, sigma, lapl, tau, eps) ;
    }

  }